

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factorize(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_00;
  type_conflict5 tVar1;
  int iVar2;
  SPxStatusException *this_00;
  SPxInternalCodeException *this_01;
  ulong uVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  this->updateCount = 0;
  iVar2 = (*this->factor->_vptr_SLinSolver[5])
                    (this->factor,(this->matrix).data,(ulong)(uint)(this->matrix).thesize);
  if (iVar2 == 2) {
    if (this->thestatus != SINGULAR) {
      this->thestatus = SINGULAR;
    }
    this->factorized = false;
  }
  else {
    if (iVar2 != 0) {
      std::operator<<((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n");
      this->factorized = false;
      this_01 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XBASIS01 This should never happen.",(allocator *)&local_128);
      SPxInternalCodeException::SPxInternalCodeException(this_01,(string *)&result);
      __cxa_throw(this_01,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if (this->thestatus == SINGULAR) {
      this->thestatus = REGULAR;
    }
    this->factorized = true;
    (*this->factor->_vptr_SLinSolver[6])(&result);
    result_00 = &this->minStab;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 0xc) =
         result.m_backend.data._M_elems._48_8_;
    *(ulong *)((this->minStab).m_backend.data._M_elems + 0xe) =
         CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 8) =
         result.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 10) =
         result.m_backend.data._M_elems._40_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 4) =
         result.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 6) =
         result.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this->minStab).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 2) =
         result.m_backend.data._M_elems._8_8_;
    (this->minStab).m_backend.exp = result.m_backend.exp;
    (this->minStab).m_backend.neg = result.m_backend.neg;
    (this->minStab).m_backend.fpclass = result.m_backend.fpclass;
    (this->minStab).m_backend.prec_elem = result.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = 0xeb1c432d;
    result.m_backend.data._M_elems[1] = 0x3f1a36e2;
    tVar1 = boost::multiprecision::operator>(result_00,(double *)&result);
    if (tVar1) {
      result.m_backend.data._M_elems[0] = 0xd2f1a9fc;
      result.m_backend.data._M_elems[1] = 0x3f50624d;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&result_00->m_backend,(double *)&result);
    }
    result.m_backend.data._M_elems[0] = 0x88e368f1;
    result.m_backend.data._M_elems[1] = 0x3ee4f8b5;
    tVar1 = boost::multiprecision::operator>(result_00,(double *)&result);
    if (tVar1) {
      result.m_backend.data._M_elems[0] = 0x47ae147b;
      result.m_backend.data._M_elems[1] = 0x3f847ae1;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&result_00->m_backend,(double *)&result);
    }
    result.m_backend.data._M_elems[0] = 0xa0b5ed8d;
    result.m_backend.data._M_elems[1] = 0x3eb0c6f7;
    tVar1 = boost::multiprecision::operator>(result_00,(double *)&result);
    if (tVar1) {
      result.m_backend.data._M_elems[0] = 0x9999999a;
      result.m_backend.data._M_elems[1] = 0x3fb99999;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&result_00->m_backend,(double *)&result);
    }
  }
  iVar2 = (*this->factor->_vptr_SLinSolver[3])();
  this->lastMem = iVar2;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,(long)iVar2,(type *)0x0);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_128,&(this->fillFactor).m_backend,&local_80);
  uVar3 = (ulong)(uint)this->nzCount;
  if (this->nzCount < 2) {
    uVar3 = 1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_d0,uVar3,(type *)0x0);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&result.m_backend,&local_128,&local_d0);
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 0xc) =
       result.m_backend.data._M_elems._48_8_;
  *(ulong *)((this->lastFill).m_backend.data._M_elems + 0xe) =
       CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 8) =
       result.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 10) =
       result.m_backend.data._M_elems._40_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 4) =
       result.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 6) =
       result.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(this->lastFill).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 2) =
       result.m_backend.data._M_elems._8_8_;
  (this->lastFill).m_backend.exp = result.m_backend.exp;
  (this->lastFill).m_backend.neg = result.m_backend.neg;
  (this->lastFill).m_backend.fpclass = result.m_backend.fpclass;
  (this->lastFill).m_backend.prec_elem = result.m_backend.prec_elem;
  uVar3 = 1;
  if (1 < this->nzCount) {
    uVar3 = (ulong)(uint)this->nzCount;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_128,uVar3,(type *)0x0);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&result.m_backend,&(this->nonzeroFactor).m_backend,&local_128);
  iVar2 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>(&result);
  this->lastNzCount = iVar2;
  if (this->thestatus != SINGULAR) {
    return;
  }
  this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&result,"Cannot factorize singular matrix",(allocator *)&local_128);
  SPxStatusException::SPxStatusException(this_00,(string *)&result);
  __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}